

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O0

void string_does_not_contain_stl_string_pointer(void)

{
  string *psVar1;
  char *in_stack_ffffffffffffffc8;
  string *this;
  int line;
  allocator *file;
  allocator local_1;
  
  psVar1 = (string *)operator_new(0x20);
  file = &local_1;
  this = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"bob",file);
  bob_pointer_abi_cxx11_ = psVar1;
  line = (int)((ulong)this >> 0x20);
  psVar1 = bob_pointer_abi_cxx11_;
  std::allocator<char>::~allocator((allocator<char> *)&local_1);
  cgreen::create_does_not_contain_string_constraint((string *)bob_pointer_abi_cxx11_,"bob_pointer");
  cgreen::assert_that_<char_const*>
            ((char *)file,line,(char *)psVar1,in_stack_ffffffffffffffc8,(Constraint *)0x123624);
  return;
}

Assistant:

Ensure(string_does_not_contain_stl_string_pointer) {
    bob_pointer = new std::string("bob");
    assert_that("alice", does_not_contain_string(bob_pointer));
}